

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write.c
# Opt level: O2

void set_writer_options(bsdtar *bsdtar,archive *a)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  char *options;
  int *piVar4;
  
  pcVar2 = getenv("TAR_WRITER_OPTIONS");
  if (pcVar2 != (char *)0x0) {
    sVar3 = strlen(pcVar2);
    options = (char *)malloc(sVar3 + 0x1f);
    if (options == (char *)0x0) {
      piVar4 = __errno_location();
      lafe_errc(1,*piVar4,"Out of memory");
    }
    builtin_strncpy(options,"__ignore_wrong_module_name__,",0x1d);
    strcpy(options + 0x1d,pcVar2);
    iVar1 = archive_write_set_options(a,options);
    free(options);
    if (iVar1 < -0x14) goto LAB_00111f93;
    archive_clear_error(a);
  }
  iVar1 = archive_write_set_options(a,bsdtar->option_options);
  if (iVar1 == 0) {
    return;
  }
LAB_00111f93:
  pcVar2 = archive_error_string(a);
  lafe_errc(1,0,"%s",pcVar2);
}

Assistant:

static void
set_writer_options(struct bsdtar *bsdtar, struct archive *a)
{
	const char *writer_options;
	int r;

	writer_options = getenv(ENV_WRITER_OPTIONS);
	if (writer_options != NULL) {
		char *p;
		/* Set default write options. */
		p = malloc(sizeof(IGNORE_WRONG_MODULE_NAME)
		    + strlen(writer_options) + 1);
		if (p == NULL)
			lafe_errc(1, errno, "Out of memory");
		/* Prepend magic code to ignore options for
		 * a format or filters which are not added to
		 * the archive write object. */
		strncpy(p, IGNORE_WRONG_MODULE_NAME,
		    sizeof(IGNORE_WRONG_MODULE_NAME) -1);
		strcpy(p + sizeof(IGNORE_WRONG_MODULE_NAME) -1, writer_options);
		r = archive_write_set_options(a, p);
		free(p);
		if (r < ARCHIVE_WARN)
			lafe_errc(1, 0, "%s", archive_error_string(a));
		else
			archive_clear_error(a);
	}
	if (ARCHIVE_OK != archive_write_set_options(a, bsdtar->option_options))
		lafe_errc(1, 0, "%s", archive_error_string(a));
}